

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void AddPoint(fstream *fin)

{
  istream *this;
  ostream *this_00;
  istream *in_RDI;
  double y;
  double x;
  int id;
  double in_stack_ffffffffffffffe0;
  double in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff4;
  
  std::istream::operator>>(in_RDI,(int *)&stack0xfffffffffffffff4);
  this = (istream *)std::istream::operator>>(in_RDI,(double *)&stack0xffffffffffffffe8);
  std::istream::operator>>(this,(double *)&stack0xffffffffffffffe0);
  switch(environment_variable) {
  case 2:
    AddPointFromAddPointBeforeQueryPolygon
              (in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    break;
  case 3:
    AddPointFromAddBeforeQuery
              (in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    break;
  default:
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Good morning, and in case I don\'t see ya, good afternoon, good evening, and good night!"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    break;
  case 5:
    AddPointFromMixQueryPolygon
              (in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    break;
  case 6:
    AddPointFromMixQuery
              (in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void AddPoint(std::fstream &fin) {
    int id;
    double x;
    double y;
    fin >> id;
    fin >> x >> y;

    switch (environment_variable) {
        case 2: {
            AddPointFromAddPointBeforeQueryPolygon(id, x, y);
            break;
        }
        case 3: {
            AddPointFromAddBeforeQuery(id, x, y);
            break;
        }
        case 5: {
            AddPointFromMixQueryPolygon(id, x, y);
            break;
        }
        case 6: {
            AddPointFromMixQuery(id, x, y);
            break;
        }
        default:
            std::cout << "Good morning, and in case I don't see ya, good afternoon, good evening, and good night!" << std::endl;
    }
}